

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void doprev_message(void)

{
  nh_menuitem_conflict *pnVar1;
  uint uVar2;
  char *pcVar3;
  nh_menuitem_conflict *items;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  long lVar12;
  wchar_t wVar13;
  long lVar14;
  bool bVar15;
  wchar_t local_d0;
  char **output;
  wchar_t local_b8;
  wchar_t output_count;
  ulong local_b0;
  char buf [120];
  
  wVar13 = histsize;
  uVar5 = 0;
  wVar10 = histpos;
  wVar11 = L'\0';
  if (L'\0' < histsize) {
    wVar11 = histsize;
  }
  while( true ) {
    wVar10 = wVar10 + L'\x01';
    bVar15 = wVar11 == L'\0';
    wVar11 = wVar11 + L'\xffffffff';
    if (bVar15) break;
    if ((int)uVar5 < msghistory[wVar10 % histsize].turn) {
      uVar5 = (ulong)(uint)msghistory[wVar10 % histsize].turn;
    }
  }
  iVar6 = 0;
  wVar10 = L'\n';
  for (; (int)uVar5 != 0; uVar5 = uVar5 / 10) {
    iVar6 = iVar6 + 1;
  }
  uVar7 = iVar6 + (uint)(iVar6 == 0);
  items = (nh_menuitem_conflict *)malloc(0xa78);
  local_b8 = L'I' - uVar7;
  local_b0 = (ulong)local_b8;
  local_d0 = L'\0';
  wVar11 = L'\0';
  uVar8 = 0;
  while (wVar11 < wVar13) {
    wVar11 = wVar11 + L'\x01';
    iVar6 = (histpos + wVar11) % wVar13;
    uVar2 = msghistory[iVar6].turn;
    wVar13 = histsize;
    if (uVar2 != 0) {
      pcVar3 = msghistory[iVar6].msg;
      sVar4 = strlen(pcVar3);
      lVar14 = (long)local_d0;
      if (local_b0 < sVar4) {
        ui_wrap_text(local_b8,pcVar3,&output_count,&output);
        if (uVar2 == uVar8) {
          snprintf(buf,0x78,"\t%s");
        }
        else {
          snprintf(buf,0x78,"T:%*d\t%s");
        }
        if (wVar10 <= local_d0) {
          wVar10 = wVar10 * 2;
          items = (nh_menuitem_conflict *)realloc(items,(long)wVar10 * 0x10c);
        }
        pnVar1 = items + lVar14;
        pnVar1->id = L'\0';
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,buf);
        lVar12 = lVar14 * 0x10c + 0x216;
        for (lVar9 = 1; lVar9 < output_count; lVar9 = lVar9 + 1) {
          snprintf(buf,0x78,"\t%s");
          if ((long)wVar10 <= lVar14 + lVar9) {
            wVar10 = wVar10 * 2;
            items = (nh_menuitem_conflict *)realloc(items,(long)wVar10 * 0x10c);
          }
          pcVar3 = items->caption + lVar12 + -8;
          *(undefined8 *)(pcVar3 + -0x10a) = 0;
          *(undefined2 *)(pcVar3 + -2) = MI_TEXT >> 0x10;
          *pcVar3 = '\0';
          strcpy(pcVar3 + -0x102,buf);
          lVar12 = lVar12 + 0x10c;
        }
        local_d0 = local_d0 + (int)lVar9;
        ui_free_wrap(output);
        wVar13 = histsize;
        uVar8 = uVar2;
      }
      else {
        if (uVar2 == uVar8) {
          snprintf(buf,0x78,"\t%s");
        }
        else {
          snprintf(buf,0x78,"T:%*d\t%s",(ulong)uVar7,(ulong)uVar2,pcVar3);
        }
        if (wVar10 <= local_d0) {
          wVar10 = wVar10 * 2;
          items = (nh_menuitem_conflict *)realloc(items,(long)wVar10 * 0x10c);
        }
        pnVar1 = items + lVar14;
        pnVar1->id = L'\0';
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,buf);
        local_d0 = local_d0 + L'\x01';
        wVar13 = histsize;
        uVar8 = uVar2;
      }
    }
  }
  curses_display_menu_bottom(items,local_d0,"Message history:",L'\0',(wchar_t *)0x0);
  free(items);
  return;
}

Assistant:

void doprev_message(void)
{
    /* 80 chars - 2 (borders) - 2 (gutters) - "T:" - 1 (divider) */
    const int hist_msg_width = 73;

    int prevturn;
    int pos;
    int maxturn, maxturn_width;

    struct nh_menuitem *items;
    char buf[MSGLEN+1];
    int icount, size, i;

    /* keep the previous messages window within 80 characters */
    maxturn = 0;
    for (i = 0; i < histsize; i++) {
	pos = (histpos + i + 1) % histsize;
	if (msghistory[pos].turn > maxturn)
	    maxturn = msghistory[pos].turn;
    }
    maxturn_width = 0;
    while (maxturn) {
	maxturn_width++;
	maxturn /= 10;
    }
    if (maxturn_width < 1)
	maxturn_width = 1;

    /* Prevent duplicate turn stamps. */
    prevturn = 0;

    icount = 0;
    size = 10;
    items = malloc(size * sizeof(struct nh_menuitem));

    for (i = 0; i < histsize; i++) {
	int turn;
	const char *msg;

	pos = (histpos + i + 1) % histsize;

	if (!msghistory[pos].turn)
	    continue;

	turn = msghistory[pos].turn;
	msg = msghistory[pos].msg;

	if (strlen(msg) <= hist_msg_width - maxturn_width) {
	    if (turn != prevturn)
		snprintf(buf, MSGLEN+1, "T:%*d\t%s", maxturn_width, turn, msg);
	    else
		snprintf(buf, MSGLEN+1, "\t%s", msg);
	    add_menu_txt(items, size, icount, buf, MI_TEXT);
	} else {
	    int output_count, j;
	    char **output;

	    ui_wrap_text(hist_msg_width - maxturn_width, msg, &output_count, &output);

	    if (turn != prevturn)
		snprintf(buf, MSGLEN+1, "T:%*d\t%s", maxturn_width, turn, output[0]);
	    else
		snprintf(buf, MSGLEN+1, "\t%s", output[0]);
	    add_menu_txt(items, size, icount, buf, MI_TEXT);

	    for (j = 1; j < output_count; j++) {
		snprintf(buf, MSGLEN+1, "\t%s", output[j]);
		add_menu_txt(items, size, icount, buf, MI_TEXT);
	    }

	    ui_free_wrap(output);
	}

	prevturn = turn;
    }

    curses_display_menu_bottom(items, icount, "Message history:", PICK_NONE, NULL);
    free(items);
}